

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O2

int xmlSchematronRegisterVariables
              (xmlSchematronValidCtxtPtr vctxt,xmlXPathContextPtr_conflict ctxt,
              xmlSchematronLetPtr_conflict let,xmlDocPtr instance,xmlNodePtr cur)

{
  int iVar1;
  xmlDocPtr value;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *msg;
  int error;
  
  ctxt->doc = instance;
  ctxt->node = cur;
  error = 0x1d8ee8;
  while( true ) {
    if (let == (xmlSchematronLetPtr_conflict)0x0) {
      return 0;
    }
    value = (xmlDocPtr)xmlXPathCompiledEval(let->comp,ctxt);
    msg = extraout_RDX;
    if (value == (xmlDocPtr)0x0) break;
    iVar1 = xmlXPathRegisterVariableNS(ctxt,let->name,(xmlChar *)0x0,(xmlXPathObjectPtr)value);
    instance = value;
    if (iVar1 != 0) {
      error = 0x1d8f12;
      msg = extraout_RDX_00;
      break;
    }
    let = let->next;
  }
  xmlSchematronVErr(vctxt,error,msg,(xmlChar *)instance);
  return -1;
}

Assistant:

static int
xmlSchematronRegisterVariables(xmlSchematronValidCtxtPtr vctxt,
                               xmlXPathContextPtr ctxt,
                               xmlSchematronLetPtr let,
                               xmlDocPtr instance, xmlNodePtr cur)
{
    xmlXPathObjectPtr let_eval;

    ctxt->doc = instance;
    ctxt->node = cur;
    while (let != NULL) {
        let_eval = xmlXPathCompiledEval(let->comp, ctxt);
        if (let_eval == NULL) {
            xmlSchematronVErr(vctxt, XML_ERR_INTERNAL_ERROR,
                              "Evaluation of compiled expression failed\n",
                              NULL);
            return -1;
        }
        if(xmlXPathRegisterVariableNS(ctxt, let->name, NULL, let_eval)) {
            xmlSchematronVErr(vctxt, XML_ERR_INTERNAL_ERROR,
                              "Registering a let variable failed\n", NULL);
            return -1;
        }
        let = let->next;
    }
    return 0;
}